

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O0

void EPD_DrawMatrix(uint16_t Xpos,uint16_t Ypos,uint16_t Width,uint16_t High,uint16_t *Matrix)

{
  ushort uVar1;
  double Gray;
  uint16_t temp;
  uint16_t B;
  uint16_t G;
  uint16_t R;
  uint16_t y;
  uint16_t x;
  uint16_t j;
  uint16_t i;
  uint16_t *Matrix_local;
  uint16_t High_local;
  uint16_t Width_local;
  uint16_t Ypos_local;
  uint16_t Xpos_local;
  
  G = Ypos;
  for (temp = 0; temp < High; temp = temp + 1) {
    R = Xpos;
    for (B = 0; B < Width; B = B + 1) {
      uVar1 = Matrix[(uint)temp * 0x226 + (uint)B];
      EPD_DrawPixel(R,G,(uint8_t)(int)(double)(((uint)(ushort)((uVar1 & 0x1f) << 3) * 0x72 + 500 +
                                               (uint)(uVar1 >> 8 & 0xf8) * 299 +
                                               ((uVar1 & 0x7e0) >> 3) * 0x24b) / 1000));
      R = R + 1;
    }
    G = G + 1;
  }
  return;
}

Assistant:

void EPD_DrawMatrix(uint16_t Xpos, uint16_t Ypos,uint16_t Width, uint16_t High,const uint16_t* Matrix)
{
	uint16_t i,j,x,y;
	uint16_t R,G,B,temp;
	double Gray;
	
	for (y=0,j=Ypos;y<High;y++,j++)
	{
 		for (x=0,i=Xpos;x<Width;x++,i++)
		{
			temp = Matrix[y*550+x];
			R = (temp >> 11)<<3;
			G = ((temp&0x07E0) >> 5)<<2;
			B = (temp&0x001F) <<3;
			Gray = (R*299 + G*587 + B*114 + 500) / 1000;
			EPD_DrawPixel(i, j, Gray);
		}
	}
}